

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O1

longlong turbo_linecount_handle(int fhandle,tlc_error_t *error,char **errorstring)

{
  tlc_linecount_t tVar1;
  char *pcVar2;
  tlc_string_t errstr;
  tlc_string_t local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  tVar1 = TURBOLINECOUNT::CLineCount::LineCount(fhandle,error,&local_38);
  if (errorstring != (char **)0x0) {
    pcVar2 = strdup(local_38._M_dataplus._M_p);
    *errorstring = pcVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return tVar1;
}

Assistant:

long long turbo_linecount_handle(int fhandle, tlc_error_t * error, char ** errorstring)
#endif
{
	TURBOLINECOUNT::tlc_string_t errstr;

	long long linecount = TURBOLINECOUNT::CLineCount::LineCount(fhandle, error, &errstr);

	if (errorstring)
	{
		*errorstring = _tcsdup(errstr.c_str());
	}

	return linecount;
}